

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O0

toptenentry * read_topten(int fd,int limit)

{
  boolean bVar1;
  char *__ptr;
  toptenentry *ptVar2;
  char *local_38;
  char *line;
  char *data;
  toptenentry *ttlist;
  int size;
  int i;
  int limit_local;
  int fd_local;
  
  size = limit;
  i = fd;
  lseek(fd,0,0);
  __ptr = loadfile(i,(int *)&ttlist);
  if (__ptr == (char *)0x0) {
    _limit_local = (toptenentry *)calloc((long)(size + 1),0xc0);
  }
  else {
    ptVar2 = (toptenentry *)calloc((long)(size + 1),0xc0);
    ttlist._4_4_ = 0;
    local_38 = __ptr;
    while ((ttlist._4_4_ < size &&
           (bVar1 = readentry(local_38,ptVar2 + ttlist._4_4_), bVar1 != '\0'))) {
      local_38 = strchr(local_38,10);
      local_38 = local_38 + 1;
      ttlist._4_4_ = ttlist._4_4_ + 1;
    }
    free(__ptr);
    _limit_local = ptVar2;
  }
  return _limit_local;
}

Assistant:

static struct toptenentry *read_topten(int fd, int limit)
{
    int i, size;
    struct toptenentry *ttlist;
    char *data, *line;
    
    lseek(fd, 0, SEEK_SET);
    data = loadfile(fd, &size);
    if (!data)
	/* the only sensible reason for not getting any data is that the record
	 * file doesn't exist or is empty. If it does have data but is unreadable
	 * for some other reason, writing will fail later on, so pretending it's
	 * empty won't hurt anything. */
	return calloc(limit + 1, sizeof(struct toptenentry));
   
    ttlist = calloc(limit + 1, sizeof(struct toptenentry));
    line = data;
    for (i = 0; i < limit; i++) {
	if (!readentry(line, &ttlist[i]))
	    break;
	line = strchr(line, '\n') + 1;
    }
    
    free(data);
    return ttlist;
}